

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptIterationStatement
          (HlslGrammar *this,TIntermNode **statement,TAttributes *attributes)

{
  int *piVar1;
  HlslParseContext *pHVar2;
  bool bVar3;
  EHlslTokenClass EVar4;
  TIntermAggregate *pTVar5;
  TIntermNode *body;
  char *syntax;
  TIntermediate *this_00;
  TIntermTyped *condition;
  TIntermLoop *loopNode;
  TSourceLoc loc;
  TIntermTyped *iterator;
  TIntermNode *initNode;
  
  loc.column = (this->super_HlslTokenStream).token.loc.column;
  loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  loc.name = (this->super_HlslTokenStream).token.loc.name;
  loc.string = (this->super_HlslTokenStream).token.loc.string;
  loc.line = (this->super_HlslTokenStream).token.loc.line;
  condition = (TIntermTyped *)0x0;
  EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (2 < EVar4 - EHTokFor) {
    __assert_fail("loop == EHTokDo || loop == EHTokFor || loop == EHTokWhile",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                  ,0xfb9,
                  "bool glslang::HlslGrammar::acceptIterationStatement(TIntermNode *&, const TAttributes &)"
                 );
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  loopNode = (TIntermLoop *)0x0;
  if (EVar4 == EHTokFor) {
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (!bVar3) {
      expected(this,"(");
    }
    HlslParseContext::pushScope(this->parseContext);
    initNode = (TIntermNode *)0x0;
    bVar3 = acceptSimpleStatement(this,&initNode);
    if (!bVar3) {
      expected(this,"for-loop initializer statement");
    }
    pHVar2 = this->parseContext;
    piVar1 = &(pHVar2->super_TParseContextBase).loopNestingLevel;
    *piVar1 = *piVar1 + 1;
    piVar1 = &(pHVar2->super_TParseContextBase).controlFlowNestingLevel;
    *piVar1 = *piVar1 + 1;
    acceptExpression(this,&condition);
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    if (!bVar3) {
      expected(this,";");
    }
    if ((condition != (TIntermTyped *)0x0) &&
       (condition = HlslParseContext::convertConditionalExpression
                              (this->parseContext,&loc,condition,true),
       condition == (TIntermTyped *)0x0)) {
      return false;
    }
    iterator = (TIntermTyped *)0x0;
    acceptExpression(this,&iterator);
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (!bVar3) {
      expected(this,")");
    }
    bVar3 = acceptScopedStatement(this,statement);
    if (!bVar3) {
      syntax = "for sub-statement";
      goto LAB_003abb18;
    }
    pTVar5 = TIntermediate::addForLoop
                       (this->intermediate,*statement,initNode,condition,iterator,true,&loc,
                        &loopNode);
    *statement = (TIntermNode *)pTVar5;
    HlslParseContext::popScope(this->parseContext);
    pHVar2 = this->parseContext;
    piVar1 = &(pHVar2->super_TParseContextBase).loopNestingLevel;
    *piVar1 = *piVar1 + -1;
    piVar1 = &(pHVar2->super_TParseContextBase).controlFlowNestingLevel;
    *piVar1 = *piVar1 + -1;
  }
  else {
    if (EVar4 == EHTokDo) {
      pHVar2 = this->parseContext;
      piVar1 = &(pHVar2->super_TParseContextBase).loopNestingLevel;
      *piVar1 = *piVar1 + 1;
      piVar1 = &(pHVar2->super_TParseContextBase).controlFlowNestingLevel;
      *piVar1 = *piVar1 + 1;
      bVar3 = acceptScopedStatement(this,statement);
      if (!bVar3) {
        syntax = "do sub-statement";
LAB_003abb18:
        expected(this,syntax);
        return false;
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokWhile);
      if (!bVar3) {
        syntax = "while";
        goto LAB_003abb18;
      }
      bVar3 = acceptParenExpression(this,&condition);
      if (!bVar3) {
        return false;
      }
      condition = HlslParseContext::convertConditionalExpression
                            (this->parseContext,&loc,condition,true);
      if (condition == (TIntermTyped *)0x0) {
        return false;
      }
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      if (!bVar3) {
        expected(this,";");
      }
      pHVar2 = this->parseContext;
      piVar1 = &(pHVar2->super_TParseContextBase).loopNestingLevel;
      *piVar1 = *piVar1 + -1;
      piVar1 = &(pHVar2->super_TParseContextBase).controlFlowNestingLevel;
      *piVar1 = *piVar1 + -1;
      this_00 = this->intermediate;
      body = *statement;
      bVar3 = false;
    }
    else {
      HlslParseContext::pushScope(this->parseContext);
      pHVar2 = this->parseContext;
      piVar1 = &(pHVar2->super_TParseContextBase).loopNestingLevel;
      *piVar1 = *piVar1 + 1;
      piVar1 = &(pHVar2->super_TParseContextBase).controlFlowNestingLevel;
      *piVar1 = *piVar1 + 1;
      bVar3 = acceptParenExpression(this,&condition);
      if (!bVar3) {
        return false;
      }
      condition = HlslParseContext::convertConditionalExpression
                            (this->parseContext,&loc,condition,true);
      if (condition == (TIntermTyped *)0x0) {
        return false;
      }
      bVar3 = acceptScopedStatement(this,statement);
      if (!bVar3) {
        syntax = "while sub-statement";
        goto LAB_003abb18;
      }
      pHVar2 = this->parseContext;
      piVar1 = &(pHVar2->super_TParseContextBase).loopNestingLevel;
      *piVar1 = *piVar1 + -1;
      HlslParseContext::popScope(pHVar2);
      piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
      *piVar1 = *piVar1 + -1;
      this_00 = this->intermediate;
      body = *statement;
      bVar3 = true;
    }
    loopNode = TIntermediate::addLoop(this_00,body,condition,(TIntermTyped *)0x0,bVar3,&loc);
    *statement = &loopNode->super_TIntermNode;
  }
  HlslParseContext::handleLoopAttributes(this->parseContext,&loc,loopNode,attributes);
  return true;
}

Assistant:

bool HlslGrammar::acceptIterationStatement(TIntermNode*& statement, const TAttributes& attributes)
{
    TSourceLoc loc = token.loc;
    TIntermTyped* condition = nullptr;

    EHlslTokenClass loop = peek();
    assert(loop == EHTokDo || loop == EHTokFor || loop == EHTokWhile);

    //  WHILE or DO or FOR
    advanceToken();

    TIntermLoop* loopNode = nullptr;
    switch (loop) {
    case EHTokWhile:
        // so that something declared in the condition is scoped to the lifetime
        // of the while sub-statement
        parseContext.pushScope();  // this only needs to work right if no errors
        parseContext.nestLooping();
        ++parseContext.controlFlowNestingLevel;

        // LEFT_PAREN condition RIGHT_PAREN
        if (! acceptParenExpression(condition))
            return false;
        condition = parseContext.convertConditionalExpression(loc, condition);
        if (condition == nullptr)
            return false;

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("while sub-statement");
            return false;
        }

        parseContext.unnestLooping();
        parseContext.popScope();
        --parseContext.controlFlowNestingLevel;

        loopNode = intermediate.addLoop(statement, condition, nullptr, true, loc);
        statement = loopNode;
        break;

    case EHTokDo:
        parseContext.nestLooping();  // this only needs to work right if no errors
        ++parseContext.controlFlowNestingLevel;

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("do sub-statement");
            return false;
        }

        // WHILE
        if (! acceptTokenClass(EHTokWhile)) {
            expected("while");
            return false;
        }

        // LEFT_PAREN condition RIGHT_PAREN
        if (! acceptParenExpression(condition))
            return false;
        condition = parseContext.convertConditionalExpression(loc, condition);
        if (condition == nullptr)
            return false;

        if (! acceptTokenClass(EHTokSemicolon))
            expected(";");

        parseContext.unnestLooping();
        --parseContext.controlFlowNestingLevel;

        loopNode = intermediate.addLoop(statement, condition, nullptr, false, loc);
        statement = loopNode;
        break;

    case EHTokFor:
    {
        // LEFT_PAREN
        if (! acceptTokenClass(EHTokLeftParen))
            expected("(");

        // so that something declared in the condition is scoped to the lifetime
        // of the for sub-statement
        parseContext.pushScope();

        // initializer
        TIntermNode* initNode = nullptr;
        if (! acceptSimpleStatement(initNode))
            expected("for-loop initializer statement");

        parseContext.nestLooping();  // this only needs to work right if no errors
        ++parseContext.controlFlowNestingLevel;

        // condition SEMI_COLON
        acceptExpression(condition);
        if (! acceptTokenClass(EHTokSemicolon))
            expected(";");
        if (condition != nullptr) {
            condition = parseContext.convertConditionalExpression(loc, condition);
            if (condition == nullptr)
                return false;
        }

        // iterator SEMI_COLON
        TIntermTyped* iterator = nullptr;
        acceptExpression(iterator);
        if (! acceptTokenClass(EHTokRightParen))
            expected(")");

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("for sub-statement");
            return false;
        }

        statement = intermediate.addForLoop(statement, initNode, condition, iterator, true, loc, loopNode);

        parseContext.popScope();
        parseContext.unnestLooping();
        --parseContext.controlFlowNestingLevel;

        break;
    }

    default:
        return false;
    }

    parseContext.handleLoopAttributes(loc, loopNode, attributes);
    return true;
}